

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O2

bool __thiscall net_uv::KCPSocket::bind6(KCPSocket *this,char *ip,uint32_t port)

{
  int iVar1;
  uv_udp_t *puVar2;
  allocator<char> local_41;
  sockaddr_in6 bind_addr;
  
  if (this->m_udp == (uv_udp_t *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&bind_addr,ip,&local_41);
    std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
    std::__cxx11::string::~string((string *)&bind_addr);
    (this->super_Socket).m_port = port;
    (this->super_Socket).m_isIPV6 = true;
    this->m_soType = SVR_SO;
    iVar1 = uv_ip6_addr(ip,port,&bind_addr);
    if (iVar1 == 0) {
      puVar2 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar2;
      uv_udp_init((this->super_Socket).m_loop,puVar2);
      puVar2 = this->m_udp;
      puVar2->data = this;
      iVar1 = uv_udp_bind(puVar2,(sockaddr *)&bind_addr,4);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool KCPSocket::bind6(const char* ip, uint32_t port)
{
	if (m_udp != NULL)
	{
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setIsIPV6(true);
	this->m_soType = KCPSOType::SVR_SO;

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);

	if (r != 0)
	{
		return false;
	}

	m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
	r = uv_udp_init(m_loop, m_udp);
	CHECK_UV_ASSERT(r);
	m_udp->data = this;

	r = uv_udp_bind(m_udp, (const struct sockaddr*) &bind_addr, UV_UDP_REUSEADDR);

	return (r == 0);
}